

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O0

Float __thiscall
pbrt::BVHLightSampler::PDF(BVHLightSampler *this,LightSampleContext *ctx,LightHandle *light)

{
  Tuple3<pbrt::Normal3,_float> *pTVar1;
  initializer_list<float> v;
  Normal3f n_00;
  Normal3f n_01;
  Point3f p_00;
  Point3f p_01;
  bool bVar2;
  size_t sVar3;
  LightBVHNode **ppLVar4;
  float *pfVar5;
  HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  *in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 extraout_var [60];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  Point3f PVar12;
  Float pInfinite;
  int childIndex;
  array<float,_2> ci;
  Normal3f n;
  Point3f p;
  Float pdf;
  LightBVHNode *node;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  float fVar13;
  undefined4 in_stack_fffffffffffffea4;
  float fVar14;
  HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 uVar15;
  undefined4 in_stack_fffffffffffffee4;
  Float local_b8;
  Float local_b4;
  Float *local_b0;
  undefined8 local_a8;
  array<float,_2> local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 uVar16;
  float fVar17;
  undefined8 uVar18;
  float fVar19;
  float local_2c;
  LightBVHNode *local_28;
  float local_4;
  
  this_00 = in_RDX;
  bVar2 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
          ::HasKey((HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (LightHandle *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  auVar9 = in_ZMM0._8_56_;
  auVar7 = in_ZMM0._0_16_;
  if (bVar2) {
    ppLVar4 = HashMap<pbrt::LightHandle,_pbrt::LightBVHNode_*,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
              ::operator[](this_00,(LightHandle *)in_RDX);
    local_28 = *ppLVar4;
    local_2c = 1.0;
    PVar12 = LightSampleContext::p
                       ((LightSampleContext *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    local_80 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar9;
    local_88 = vmovlpd_avx(auVar11._0_16_);
    local_90 = *(float *)(in_RSI + 0x2c);
    pTVar1 = (Tuple3<pbrt::Normal3,_float> *)(in_RSI + 0x24);
    local_98._0_4_ = pTVar1->x;
    local_98._4_4_ = pTVar1->y;
    PVar12.super_Tuple3<pbrt::Point3,_float>.z = local_80;
    PVar12.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_88;
    PVar12.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_88 >> 0x20);
    local_78 = local_98;
    fVar6 = local_90;
    uVar16 = local_98;
    fVar14 = local_90;
    uVar15 = local_88;
    fVar13 = local_80;
    auVar8._0_4_ = LightBounds::Importance
                             ((LightBounds *)CONCAT44(in_stack_ffffffffffffff94,local_90),PVar12,
                              (Normal3f)*pTVar1);
    auVar8._4_60_ = extraout_var;
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    if ((auVar8._0_4_ != 0.0) || (NAN(auVar8._0_4_))) {
      while( true ) {
        auVar10 = auVar11._0_16_;
        auVar7 = auVar8._0_16_;
        if (local_28->parent == (LightBVHNode *)0x0) break;
        p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
        p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
        p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
        n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar14;
        n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar16;
        n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar16 >> 0x20);
        local_b8 = LightBounds::Importance
                             ((LightBounds *)CONCAT44(in_stack_ffffffffffffff94,fVar6),p_00,n_00);
        p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar13;
        p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
        p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
        n_01.super_Tuple3<pbrt::Normal3,_float>.z = fVar14;
        n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar16;
        n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar16 >> 0x20);
        fVar17 = fVar14;
        uVar18 = uVar15;
        fVar19 = fVar13;
        local_b4 = LightBounds::Importance
                             ((LightBounds *)CONCAT44(in_stack_ffffffffffffff94,fVar6),p_01,n_01);
        local_b0 = &local_b8;
        local_a8 = 2;
        v._M_len._0_4_ = fVar13;
        v._M_array = (iterator)uVar15;
        v._M_len._4_4_ = in_stack_fffffffffffffee4;
        pstd::array<float,_2>::array
                  ((array<float,_2> *)CONCAT44(in_stack_fffffffffffffed4,fVar14),v);
        pfVar5 = pstd::array<float,_2>::operator[]
                           (&local_a0,
                            (long)(int)(uint)(local_28 == (local_28->parent->field_2).children[1]));
        fVar14 = *pfVar5;
        pfVar5 = pstd::array<float,_2>::operator[](&local_a0,0);
        fVar13 = *pfVar5;
        pfVar5 = pstd::array<float,_2>::operator[](&local_a0,1);
        auVar11 = ZEXT464((uint)(fVar13 + *pfVar5));
        local_2c = (fVar14 / (fVar13 + *pfVar5)) * local_2c;
        auVar8 = ZEXT464((uint)local_2c);
        local_28 = local_28->parent;
        fVar14 = fVar17;
        uVar15 = uVar18;
        fVar13 = fVar19;
      }
      sVar3 = pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>
              ::size((vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>
                      *)(in_RDI + 5));
      auVar7 = vcvtusi2ss_avx512f(auVar7,sVar3);
      fVar6 = auVar7._0_4_;
      sVar3 = pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>
              ::size((vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>
                      *)(in_RDI + 5));
      auVar7 = vcvtusi2ss_avx512f(auVar10,sVar3 + 1);
      local_4 = local_2c * (1.0 - fVar6 / auVar7._0_4_);
    }
    else {
      local_4 = 0.0;
    }
  }
  else {
    sVar3 = pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::
            size((vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *)
                 (in_RDI + 5));
    auVar7 = vcvtusi2ss_avx512f(auVar7,sVar3 + (long)(int)(uint)(*in_RDI != 0));
    local_4 = 1.0 / auVar7._0_4_;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const LightSampleContext &ctx, LightHandle light) const {
        if (!lightToNode.HasKey(light))
            return 1.f / (infiniteLights.size() + (root != nullptr ? 1 : 0));

        LightBVHNode *node = lightToNode[light];
        Float pdf = 1;

        Point3f p = ctx.p();
        Normal3f n = ctx.ns;
        if (node->lightBounds.Importance(p, n) == 0)
            return 0;

        for (; node->parent != nullptr; node = node->parent) {
            pstd::array<Float, 2> ci = {
                node->parent->children[0]->lightBounds.Importance(p, n),
                node->parent->children[1]->lightBounds.Importance(p, n)};
            int childIndex = static_cast<int>(node == node->parent->children[1]);
            DCHECK_GT(ci[childIndex], 0);
            pdf *= ci[childIndex] / (ci[0] + ci[1]);
        }

        Float pInfinite = Float(infiniteLights.size()) / Float(infiniteLights.size() + 1);
        return pdf * (1.f - pInfinite);
    }